

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionBegStr.cpp
# Opt level: O1

int __thiscall
Hpipe::InstructionBegStr::clone
          (InstructionBegStr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  InstructionBegStr *pIVar1;
  Instruction *this_00;
  InstructionNone *pIVar2;
  long lVar3;
  ulong uVar4;
  int num_active_item;
  Context local_98;
  
  lVar3 = *(long *)((long)__child_stack + 8) - *__child_stack;
  num_active_item = -1;
  if (lVar3 != 0) {
    uVar4 = 0;
    do {
      num_active_item = (int)uVar4;
      if (*(CharItem **)(*__child_stack + uVar4 * 8) ==
          (this->super_InstructionWithCode).super_Instruction.cx.pos.
          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
          _M_impl.super__Vector_impl_data._M_start
          [*(uint *)&(this->super_InstructionWithCode).super_Instruction.field_0x174]) break;
      uVar4 = (ulong)((int)uVar4 + 1);
      num_active_item = -1;
    } while (uVar4 < (ulong)(lVar3 >> 3));
  }
  if (num_active_item < 0) {
    this_00 = (Instruction *)operator_new(0x178);
    std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::vector
              ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
               &local_98,
               (vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
               __child_stack);
    local_98.mark = *(InstructionMark **)((long)__child_stack + 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_98.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)__child_stack + 0x20));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::_Rb_tree(&local_98.paths_to_strings._M_t,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
                *)((long)__child_stack + 0x38));
    local_98.flags = *(int *)((long)__child_stack + 0x68);
    Instruction::Instruction(this_00,&local_98);
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_0019a4b0;
    pIVar2 = PtrPool<Hpipe::Instruction,32>::operator<<
                       ((PtrPool<Hpipe::Instruction,32> *)__fn,(InstructionNone *)this_00);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
    ::~_Rb_tree(&local_98.paths_to_strings._M_t);
    if (local_98.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.paths_to_mark.
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.paths_to_mark.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_98.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
        .super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (int)pIVar2;
  }
  pIVar1 = (InstructionBegStr *)operator_new(0x1b0);
  InstructionBegStr(pIVar1,(Context *)__child_stack,&this->var,num_active_item,this->want_next_char)
  ;
  pIVar1 = PtrPool<Hpipe::Instruction,32>::operator<<((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar1)
  ;
  return (int)pIVar1;
}

Assistant:

Instruction *InstructionBegStr::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    int ind = ncx.pos.index_first( cx.pos[ num_active_item ] );
    if ( ind >= 0 )
        return inst_pool << new InstructionBegStr( ncx, var, ind, want_next_char );
    return inst_pool << new InstructionNone( ncx );
}